

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

const_buffer *
booster::aio::details::advance<booster::aio::const_buffer>
          (const_buffer *__return_storage_ptr__,const_buffer *buf,size_t n)

{
  int iVar1;
  ulong uVar2;
  pointer peVar3;
  long lVar4;
  long lVar5;
  
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (buf->super_buffer_impl<const_char_*>).size_;
  if (iVar1 == 0) {
    peVar3 = (pointer)0x0;
    lVar4 = 0;
  }
  else if (iVar1 == 1) {
    peVar3 = &(buf->super_buffer_impl<const_char_*>).entry_;
    lVar4 = 1;
  }
  else {
    peVar3 = (buf->super_buffer_impl<const_char_*>).vec_.
             super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(buf->super_buffer_impl<const_char_*>).vec_.
                  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)peVar3 >> 4;
  }
  lVar5 = lVar4;
  if (n != 0 && lVar4 != 0) {
    do {
      uVar2 = peVar3->size;
      if (uVar2 < n || uVar2 - n == 0) {
        n = n - uVar2;
      }
      else {
        buffer_impl<const_char_*>::add
                  (&__return_storage_ptr__->super_buffer_impl<const_char_*>,peVar3->ptr + n,
                   uVar2 - n);
        n = 0;
      }
      peVar3 = peVar3 + 1;
      lVar4 = lVar5 + -1;
    } while ((lVar5 != 1) && (lVar5 = lVar4, n != 0));
  }
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    buffer_impl<const_char_*>::add
              (&__return_storage_ptr__->super_buffer_impl<const_char_*>,
               (char *)(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                          *)&peVar3->ptr)->_M_impl).super__Vector_impl_data._M_start,
               (size_t)peVar3->size);
    peVar3 = peVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Buffer advance(Buffer const &buf,size_t n)
			{
				Buffer res;
				typename Buffer::buffer_data_type data=buf.get();
				while(data.second > 0 && n > 0) {
					if(data.first->size <= n) {
						n-= data.first->size;
						data.second--;
						data.first++;
					}
					else {
						res.add(data.first->ptr + n,data.first->size - n);
						n=0;
						data.second--;
						data.first++;
					}
				}
				while(data.second > 0) {
					res.add(data.first->ptr,data.first->size);
					data.second--;
					data.first++;
				}
				return res;
			}